

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool PairSearchOverlapHelper(ON_RTreeBBox *a_rectA,ON_RTreeBBox *a_rectB,double tolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = a_rectB->m_min[0] - a_rectA->m_max[0];
  if ((((dVar1 <= tolerance) && (dVar4 = a_rectB->m_min[1] - a_rectA->m_max[1], dVar4 <= tolerance))
      && (dVar5 = a_rectB->m_min[2] - a_rectA->m_max[2], dVar5 <= tolerance)) &&
     (((dVar2 = a_rectA->m_min[0] - a_rectB->m_max[0], dVar2 <= tolerance &&
       (dVar6 = a_rectA->m_min[1] - a_rectB->m_max[1], dVar6 <= tolerance)) &&
      (dVar3 = a_rectA->m_min[2] - a_rectB->m_max[2], dVar3 <= tolerance)))) {
    if (dVar2 <= dVar1) {
      dVar2 = dVar1;
    }
    if (dVar6 <= dVar4) {
      dVar6 = dVar4;
    }
    if (dVar3 <= dVar5) {
      dVar3 = dVar5;
    }
    return (double)((ulong)(dVar3 * dVar3) & -(ulong)(0.0 < dVar3)) +
           (double)((ulong)(dVar6 * dVar6) & -(ulong)(0.0 < dVar6)) +
           (double)((ulong)(dVar2 * dVar2) & -(ulong)(0.0 < dVar2)) <= tolerance * tolerance;
  }
  return false;
}

Assistant:

static bool PairSearchOverlapHelper( const ON_RTreeBBox* a_rectA, const ON_RTreeBBox* a_rectB, double tolerance )
{
  double dx,dy,dz,d;
  const double* mn;
  const double* mx;


  mx = a_rectA->m_max;
  mn = a_rectB->m_min;
  dx = *mn++ - *mx++;
  if ( dx > tolerance ) return false;
  dy = *mn++ - *mx++;
  if ( dy > tolerance ) return false;
  dz = *mn - *mx;
  if ( dz > tolerance ) return false;

  mx = a_rectB->m_max;
  mn = a_rectA->m_min;
  d = *mn++ - *mx++;
  if ( d > tolerance ) return false;
  if ( d > dx ) dx = d;
  d = *mn++ - *mx++;
  if ( d > tolerance ) return false;
  if ( d > dy ) dy = d;
  d = *mn++ - *mx++;
  if ( d > tolerance ) return false;
  if ( d > dz ) dz = d;

  d  = (dx > 0.0) ? dx*dx : 0.0;
  d += (dy > 0.0) ? dy*dy : 0.0;
  d += (dz > 0.0) ? dz*dz : 0.0;

  return (d <= tolerance*tolerance);
}